

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O3

StackSym * __thiscall StackSym::GetTypeEquivSym_NoCreate(StackSym *this,IRType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  StackSym *pSVar5;
  
  if (this->m_type == type) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x37e,"(this->m_type != type)","this->m_type != type");
    if (!bVar2) {
LAB_0062caf7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pSVar5 = this->m_equivNext;
  if (pSVar5 != this) {
    iVar4 = 1;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (5 < iVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                           ,900,"(i <= 5)","i <= 5");
        if (!bVar2) goto LAB_0062caf7;
        *puVar3 = 0;
      }
      if (pSVar5->m_type == type) {
        return pSVar5;
      }
      iVar4 = iVar4 + 1;
      pSVar5 = pSVar5->m_equivNext;
    } while (pSVar5 != this);
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym const *
StackSym::GetTypeEquivSym_NoCreate(IRType type) const
{
    Assert(this->m_type != type);

    StackSym *sym = this->m_equivNext;
    int i = 1;
    while (sym != this)
    {
        Assert(i <= 5); // circular of at most 6 syms : var, f64, i32, simd128I4, simd128F4, simd128D2
        if (sym->m_type == type)
        {
            return sym;
        }
        sym = sym->m_equivNext;
        i++;
    }
    return nullptr;
}